

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmComputeShaderCase.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::SpirVAssembly::SpvAsmComputeShaderInstance::iterate
          (TestStatus *__return_storage_ptr__,SpvAsmComputeShaderInstance *this)

{
  VkPipelineLayout pipelineLayout_00;
  VkDevice pVVar1;
  VkCommandBuffer_s *pVVar2;
  ComputeShaderSpec *pCVar3;
  _func_bool_vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>_ptr_vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>_ptr_vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>_ptr_TestLog_ptr
  *p_Var4;
  RefData<vk::Handle<(vk::HandleType)8>_> data;
  RefData<vk::Handle<(vk::HandleType)8>_> data_00;
  RefData<vk::Handle<(vk::HandleType)19>_> data_01;
  RefData<vk::Handle<(vk::HandleType)16>_> data_02;
  RefData<vk::Handle<(vk::HandleType)21>_> data_03;
  RefData<vk::Handle<(vk::HandleType)22>_> data_04;
  RefData<vk::Handle<(vk::HandleType)14>_> data_05;
  RefData<vk::Handle<(vk::HandleType)18>_> data_06;
  RefData<vk::Handle<(vk::HandleType)24>_> data_07;
  RefData<vk::VkCommandBuffer_s_*> data_08;
  RefData<vk::Handle<(vk::HandleType)6>_> data_09;
  BufferSp *pBVar5;
  undefined8 uVar6;
  BufferHandleUp *numBytes_00;
  VkDevice *ppVVar7;
  VkDevice *ppVVar8;
  bool bVar9;
  int iVar10;
  deUint32 queueFamilyIndex;
  VkResult VVar11;
  int iVar12;
  int iVar13;
  NotSupportedError *pNVar14;
  size_type sVar15;
  size_type sVar16;
  size_t numBindings;
  BufferInterface *pBVar17;
  undefined4 extraout_var;
  RefBase<vk::Handle<(vk::HandleType)8>_> *pRVar18;
  Allocation *pAVar19;
  undefined4 extraout_var_00;
  Handle<(vk::HandleType)8> *pHVar20;
  undefined4 extraout_var_01;
  Handle<(vk::HandleType)19> *pHVar21;
  Handle<(vk::HandleType)21> *pHVar22;
  ProgramCollection<vk::ProgramBinary> *this_00;
  ProgramBinary *binary_00;
  Handle<(vk::HandleType)16> *pHVar23;
  Handle<(vk::HandleType)14> *pHVar24;
  char *entryPoint;
  Handle<(vk::HandleType)24> *pHVar25;
  IVec3 *this_01;
  VkCommandBuffer_s **ppVVar26;
  Handle<(vk::HandleType)18> *pHVar27;
  Handle<(vk::HandleType)22> *pHVar28;
  VkQueue pVVar29;
  Handle<(vk::HandleType)6> *pHVar30;
  TestContext *this_02;
  TestLog *pTVar31;
  BufferSp *pBVar32;
  undefined4 extraout_var_02;
  reference this_03;
  void *b;
  undefined4 extraout_var_03;
  allocator<char> local_729;
  string local_728;
  const_reference local_708;
  BufferSp *expectedOutput;
  size_t outputNdx_1;
  deUint64 local_6f0;
  undefined8 uStack_6e8;
  VkSubmitInfo submitInfo;
  deUint64 infiniteTimeout;
  RefData<vk::Handle<(vk::HandleType)6>_> local_670;
  undefined1 local_650 [8];
  Unique<vk::Handle<(vk::HandleType)6>_> cmdCompleteFence;
  IVec3 *numWorkGroups;
  VkCommandBufferBeginInfo cmdBufferBeginInfo;
  Move<vk::VkCommandBuffer_s_*> local_5e8;
  RefData<vk::VkCommandBuffer_s_*> local_5c8;
  undefined1 local_5a8 [8];
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  RefData<vk::Handle<(vk::HandleType)24>_> local_568;
  undefined1 local_548 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  Move<vk::Handle<(vk::HandleType)18>_> local_518;
  RefData<vk::Handle<(vk::HandleType)18>_> local_4f8;
  undefined1 local_4d8 [8];
  Unique<vk::Handle<(vk::HandleType)18>_> computePipeline;
  RefData<vk::Handle<(vk::HandleType)14>_> local_498;
  undefined1 local_478 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> module;
  string local_450;
  ProgramBinary *local_430;
  ProgramBinary *binary;
  VkDescriptorPool local_420;
  Move<vk::Handle<(vk::HandleType)22>_> local_418;
  RefData<vk::Handle<(vk::HandleType)22>_> local_3f8;
  undefined1 local_3d8 [8];
  Unique<vk::Handle<(vk::HandleType)22>_> descriptorSet;
  RefData<vk::Handle<(vk::HandleType)21>_> local_398;
  undefined1 local_378 [8];
  Unique<vk::Handle<(vk::HandleType)21>_> descriptorPool;
  Move<vk::Handle<(vk::HandleType)16>_> local_350;
  RefData<vk::Handle<(vk::HandleType)16>_> local_330;
  undefined1 local_310 [8];
  Unique<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  RefData<vk::Handle<(vk::HandleType)19>_> local_2d0;
  undefined1 local_2b0 [8];
  Unique<vk::Handle<(vk::HandleType)19>_> descriptorSetLayout;
  SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_> local_280;
  deUint64 local_270;
  VkDescriptorBufferInfo local_268;
  undefined1 local_249;
  Move<vk::Handle<(vk::HandleType)8>_> local_248;
  RefData<vk::Handle<(vk::HandleType)8>_> local_228;
  RefBase<vk::Handle<(vk::HandleType)8>_> *local_208;
  BufferHandleUp *buffer_1;
  size_t numBytes_1;
  BufferSp *output;
  AllocationMp alloc_1;
  size_t outputNdx;
  SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_> local_1c8;
  deUint64 local_1b8;
  VkDescriptorBufferInfo local_1b0;
  undefined1 local_191;
  Move<vk::Handle<(vk::HandleType)8>_> local_190;
  RefData<vk::Handle<(vk::HandleType)8>_> local_170;
  RefBase<vk::Handle<(vk::HandleType)8>_> *local_150;
  BufferHandleUp *buffer;
  size_t numBytes;
  BufferSp *input;
  AllocationMp alloc;
  size_t inputNdx;
  size_t numBuffers;
  vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_> descriptorInfos;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  outputBuffers;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  inputBuffers;
  vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
  outputAllocs;
  vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_> inputAllocs
  ;
  string local_98;
  undefined1 local_75;
  allocator<char> local_61;
  string local_60;
  Allocator *local_40;
  Allocator *allocator;
  VkDevice *local_30;
  VkDevice *device;
  DeviceInterface *vkdi;
  VkPhysicalDeviceFeatures *features;
  SpvAsmComputeShaderInstance *this_local;
  
  features = (VkPhysicalDeviceFeatures *)this;
  this_local = (SpvAsmComputeShaderInstance *)__return_storage_ptr__;
  vkdi = (DeviceInterface *)Context::getDeviceFeatures((this->super_TestInstance).m_context);
  device = (VkDevice *)Context::getDeviceInterface((this->super_TestInstance).m_context);
  allocator = (Allocator *)Context::getDevice((this->super_TestInstance).m_context);
  local_30 = (VkDevice *)&allocator;
  local_40 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  if (((this->m_features == COMPUTE_TEST_USES_INT16) ||
      (this->m_features == COMPUTE_TEST_USES_INT16_INT64)) &&
     (*(int *)((long)&vkdi[0x14]._vptr_DeviceInterface + 4) == 0)) {
    local_75 = 1;
    pNVar14 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"shaderInt16 feature is not supported",&local_61);
    tcu::NotSupportedError::NotSupportedError(pNVar14,&local_60);
    local_75 = 0;
    __cxa_throw(pNVar14,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  if (((this->m_features == COMPUTE_TEST_USES_INT64) ||
      (this->m_features == COMPUTE_TEST_USES_INT16_INT64)) &&
     (*(int *)&vkdi[0x14]._vptr_DeviceInterface == 0)) {
    inputAllocs.
    super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
    pNVar14 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"shaderInt64 feature is not supported",
               (allocator<char> *)
               ((long)&inputAllocs.
                       super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    tcu::NotSupportedError::NotSupportedError(pNVar14,&local_98);
    inputAllocs.
    super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    __cxa_throw(pNVar14,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  std::vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>::
  vector((vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_> *)
         &outputAllocs.
          super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>::
  vector((vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_> *)
         &inputBuffers.
          super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
            *)&outputBuffers.
               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
            *)&descriptorInfos.
               super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::vector
            ((vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_> *)
             &numBuffers);
  sVar15 = std::
           vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
           ::size(&this->m_shaderSpec->inputs);
  sVar16 = std::
           vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
           ::size(&this->m_shaderSpec->outputs);
  numBindings = sVar15 + sVar16;
  for (alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_ = 0;
      uVar6 = alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
              _8_8_,
      sVar15 = std::
               vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
               ::size(&this->m_shaderSpec->inputs), (ulong)uVar6 < sVar15;
      alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_ =
           alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_
           + 1) {
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&input);
    numBytes = (size_t)std::
                       vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                       ::operator[](&this->m_shaderSpec->inputs,
                                    alloc.
                                    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
                                    .m_data._8_8_);
    pBVar17 = de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::operator->
                        ((SharedPtr<vkt::SpirVAssembly::BufferInterface> *)numBytes);
    iVar10 = (*pBVar17->_vptr_BufferInterface[2])();
    buffer = (BufferHandleUp *)CONCAT44(extraout_var,iVar10);
    pRVar18 = (RefBase<vk::Handle<(vk::HandleType)8>_> *)operator_new(0x20);
    local_191 = 1;
    anon_unknown.dwarf_626f6c::createBufferAndBindMemory
              (&local_190,(DeviceInterface *)device,local_30,local_40,(size_t)buffer,
               (AllocationMp *)&input);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_170,(Move *)&local_190);
    data.deleter.m_deviceIface._0_4_ = (int)local_170.deleter.m_deviceIface;
    data.object.m_internal = local_170.object.m_internal;
    data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_170.deleter.m_deviceIface >> 0x20);
    data.deleter.m_device = local_170.deleter.m_device;
    data.deleter.m_allocator = local_170.deleter.m_allocator;
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)8>_> *)pRVar18,data);
    local_191 = 0;
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_190);
    ppVVar8 = device;
    ppVVar7 = local_30;
    local_150 = pRVar18;
    pAVar19 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator*((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&input);
    numBytes_00 = buffer;
    pBVar17 = de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::operator->
                        ((SharedPtr<vkt::SpirVAssembly::BufferInterface> *)numBytes);
    iVar10 = (*pBVar17->_vptr_BufferInterface[3])();
    anon_unknown.dwarf_626f6c::setMemory
              ((DeviceInterface *)ppVVar8,ppVVar7,pAVar19,(size_t)numBytes_00,
               (void *)CONCAT44(extraout_var_00,iVar10));
    pHVar20 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*(local_150);
    local_1b8 = pHVar20->m_internal;
    ::vk::makeDescriptorBufferInfo(&local_1b0,(VkBuffer)local_1b8,0,(VkDeviceSize)buffer);
    std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::push_back
              ((vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_> *)
               &numBuffers,&local_1b0);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>::SharedPtr
              (&local_1c8,(Unique<vk::Handle<(vk::HandleType)8>_> *)local_150);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
    ::push_back((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
                 *)&outputBuffers.
                    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1c8);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>::~SharedPtr(&local_1c8);
    pAVar19 = de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::release
                        ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&input);
    de::SharedPtr<vk::Allocation>::SharedPtr((SharedPtr<vk::Allocation> *)&outputNdx,pAVar19);
    std::vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>::
    push_back((vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
               *)&outputAllocs.
                  super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&outputNdx);
    de::SharedPtr<vk::Allocation>::~SharedPtr((SharedPtr<vk::Allocation> *)&outputNdx);
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&input);
  }
  for (alloc_1.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_ =
            0; uVar6 = alloc_1.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
                       .m_data._8_8_,
      sVar15 = std::
               vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
               ::size(&this->m_shaderSpec->outputs), (ulong)uVar6 < sVar15;
      alloc_1.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_ =
           alloc_1.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
           _8_8_ + 1) {
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&output);
    numBytes_1 = (size_t)std::
                         vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                         ::operator[](&this->m_shaderSpec->outputs,
                                      alloc_1.
                                      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
                                      .m_data._8_8_);
    pBVar17 = de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::operator->
                        ((SharedPtr<vkt::SpirVAssembly::BufferInterface> *)numBytes_1);
    iVar10 = (*pBVar17->_vptr_BufferInterface[2])();
    buffer_1 = (BufferHandleUp *)CONCAT44(extraout_var_01,iVar10);
    pRVar18 = (RefBase<vk::Handle<(vk::HandleType)8>_> *)operator_new(0x20);
    local_249 = 1;
    anon_unknown.dwarf_626f6c::createBufferAndBindMemory
              (&local_248,(DeviceInterface *)device,local_30,local_40,(size_t)buffer_1,
               (AllocationMp *)&output);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_228,(Move *)&local_248);
    data_00.deleter.m_deviceIface._0_4_ = (int)local_228.deleter.m_deviceIface;
    data_00.object.m_internal = local_228.object.m_internal;
    data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_228.deleter.m_deviceIface >> 0x20);
    data_00.deleter.m_device = local_228.deleter.m_device;
    data_00.deleter.m_allocator = local_228.deleter.m_allocator;
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)8>_> *)pRVar18,data_00);
    local_249 = 0;
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_248);
    ppVVar8 = device;
    ppVVar7 = local_30;
    local_208 = pRVar18;
    pAVar19 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator*((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&output);
    anon_unknown.dwarf_626f6c::fillMemoryWithValue
              ((DeviceInterface *)ppVVar8,ppVVar7,pAVar19,(size_t)buffer_1,0xff);
    pHVar20 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*(local_208);
    local_270 = pHVar20->m_internal;
    ::vk::makeDescriptorBufferInfo(&local_268,(VkBuffer)local_270,0,(VkDeviceSize)buffer_1);
    std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::push_back
              ((vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_> *)
               &numBuffers,&local_268);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>::SharedPtr
              (&local_280,(Unique<vk::Handle<(vk::HandleType)8>_> *)local_208);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
    ::push_back((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
                 *)&descriptorInfos.
                    super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_280);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>::~SharedPtr(&local_280);
    pAVar19 = de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::release
                        ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&output);
    de::SharedPtr<vk::Allocation>::SharedPtr
              ((SharedPtr<vk::Allocation> *)
               &descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
                m_allocator,pAVar19);
    std::vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>::
    push_back((vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
               *)&inputBuffers.
                  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
              (value_type *)
              &descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
               m_allocator);
    de::SharedPtr<vk::Allocation>::~SharedPtr
              ((SharedPtr<vk::Allocation> *)
               &descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
                m_allocator);
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&output);
  }
  anon_unknown.dwarf_626f6c::createDescriptorSetLayout
            ((Move<vk::Handle<(vk::HandleType)19>_> *)
             &pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
              m_allocator,(DeviceInterface *)device,local_30,numBindings);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_2d0,
             (Move *)&pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
                      m_allocator);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_2d0.deleter.m_deviceIface;
  data_01.object.m_internal = local_2d0.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_2d0.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device = local_2d0.deleter.m_device;
  data_01.deleter.m_allocator = local_2d0.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_2b0,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)19>_> *)
             &pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
              m_allocator);
  ppVVar8 = device;
  ppVVar7 = local_30;
  pHVar21 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_2b0);
  descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar21->m_internal;
  anon_unknown.dwarf_626f6c::createPipelineLayout
            (&local_350,(DeviceInterface *)ppVVar8,ppVVar7,
             (VkDescriptorSetLayout)
             descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
             m_allocator);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_330,(Move *)&local_350);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_330.deleter.m_deviceIface;
  data_02.object.m_internal = local_330.object.m_internal;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_330.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device = local_330.deleter.m_device;
  data_02.deleter.m_allocator = local_330.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_310,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move(&local_350);
  inputNdx._0_4_ = (deUint32)numBindings;
  anon_unknown.dwarf_626f6c::createDescriptorPool
            ((Move<vk::Handle<(vk::HandleType)21>_> *)
             &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool,
             (DeviceInterface *)device,local_30,(deUint32)inputNdx);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_398,
             (Move *)&descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                      m_pool);
  data_03.deleter.m_deviceIface._0_4_ = (int)local_398.deleter.m_deviceIface;
  data_03.object.m_internal = local_398.object.m_internal;
  data_03.deleter.m_deviceIface._4_4_ = (int)((ulong)local_398.deleter.m_deviceIface >> 0x20);
  data_03.deleter.m_device = local_398.deleter.m_device;
  data_03.deleter.m_allocator = local_398.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_378,data_03);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)21>_> *)
             &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
  ppVVar8 = device;
  ppVVar7 = local_30;
  pHVar22 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)21>_> *)local_378);
  local_420.m_internal = pHVar22->m_internal;
  pHVar21 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_2b0);
  binary = (ProgramBinary *)pHVar21->m_internal;
  anon_unknown.dwarf_626f6c::createDescriptorSet
            (&local_418,(DeviceInterface *)ppVVar8,ppVVar7,local_420,(VkDescriptorSetLayout)binary,
             numBindings,
             (vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_> *)
             &numBuffers);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_3f8,(Move *)&local_418);
  data_04.deleter.m_deviceIface._0_4_ = (int)local_3f8.deleter.m_deviceIface;
  data_04.object.m_internal = local_3f8.object.m_internal;
  data_04.deleter.m_deviceIface._4_4_ = (int)((ulong)local_3f8.deleter.m_deviceIface >> 0x20);
  data_04.deleter.m_device = local_3f8.deleter.m_device;
  data_04.deleter.m_pool.m_internal = local_3f8.deleter.m_pool.m_internal;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_3d8,data_04);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(&local_418);
  this_00 = Context::getBinaryCollection((this->super_TestInstance).m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_450,"compute",
             (allocator<char> *)
             ((long)&module.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                     m_allocator + 7));
  binary_00 = ::vk::ProgramCollection<vk::ProgramBinary>::get(this_00,&local_450);
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&module.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                     m_allocator + 7));
  local_430 = binary_00;
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)
             &computePipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
              m_allocator,(DeviceInterface *)device,*local_30,binary_00,0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_498,
             (Move *)&computePipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                      m_allocator);
  data_05.deleter.m_deviceIface._0_4_ = (int)local_498.deleter.m_deviceIface;
  data_05.object.m_internal = local_498.object.m_internal;
  data_05.deleter.m_deviceIface._4_4_ = (int)((ulong)local_498.deleter.m_deviceIface >> 0x20);
  data_05.deleter.m_device = local_498.deleter.m_device;
  data_05.deleter.m_allocator = local_498.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_478,data_05);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)14>_> *)
             &computePipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
              m_allocator);
  ppVVar8 = device;
  ppVVar7 = local_30;
  pHVar23 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_310);
  pipelineLayout_00.m_internal = pHVar23->m_internal;
  pHVar24 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_478);
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar24->m_internal;
  entryPoint = (char *)std::__cxx11::string::c_str();
  anon_unknown.dwarf_626f6c::createComputePipeline
            (&local_518,(DeviceInterface *)ppVVar8,ppVVar7,pipelineLayout_00,
             (VkShaderModule)
             cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator,
             entryPoint,&this->m_shaderSpec->specConstants);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_4f8,(Move *)&local_518);
  data_06.deleter.m_deviceIface._0_4_ = (int)local_4f8.deleter.m_deviceIface;
  data_06.object.m_internal = local_4f8.object.m_internal;
  data_06.deleter.m_deviceIface._4_4_ = (int)((ulong)local_4f8.deleter.m_deviceIface >> 0x20);
  data_06.deleter.m_device = local_4f8.deleter.m_device;
  data_06.deleter.m_allocator = local_4f8.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_4d8,data_06);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_518);
  ppVVar7 = device;
  pVVar1 = *local_30;
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  anon_unknown.dwarf_626f6c::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,
             (DeviceInterface *)ppVVar7,pVVar1,queueFamilyIndex);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_568,
             (Move *)&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  data_07.deleter.m_deviceIface._0_4_ = (int)local_568.deleter.m_deviceIface;
  data_07.object.m_internal = local_568.object.m_internal;
  data_07.deleter.m_deviceIface._4_4_ = (int)((ulong)local_568.deleter.m_deviceIface >> 0x20);
  data_07.deleter.m_device = local_568.deleter.m_device;
  data_07.deleter.m_allocator = local_568.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_548,data_07);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  ppVVar7 = device;
  pVVar1 = *local_30;
  pHVar25 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_548);
  ::vk::allocateCommandBuffer
            (&local_5e8,(DeviceInterface *)ppVVar7,pVVar1,(VkCommandPool)pHVar25->m_internal,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_5c8,(Move *)&local_5e8);
  data_08.deleter.m_deviceIface._0_4_ = (int)local_5c8.deleter.m_deviceIface;
  data_08.object = local_5c8.object;
  data_08.deleter.m_deviceIface._4_4_ = (int)((ulong)local_5c8.deleter.m_deviceIface >> 0x20);
  data_08.deleter.m_device = local_5c8.deleter.m_device;
  data_08.deleter.m_pool.m_internal = local_5c8.deleter.m_pool.m_internal;
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_5a8,data_08);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_5e8);
  ppVVar7 = device;
  cmdBufferBeginInfo.pNext = (void *)0x1;
  cmdBufferBeginInfo.flags = 0;
  cmdBufferBeginInfo._20_4_ = 0;
  numWorkGroups = (IVec3 *)0x2a;
  cmdBufferBeginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  cmdBufferBeginInfo._4_4_ = 0;
  this_01 = &this->m_shaderSpec->numWorkGroups;
  ppVVar26 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_5a8);
  VVar11 = (**(code **)(*ppVVar7 + 0x248))(ppVVar7,*ppVVar26,&numWorkGroups);
  ::vk::checkResult(VVar11,"vkdi.beginCommandBuffer(*cmdBuffer, &cmdBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/spirv_assembly/vktSpvAsmComputeShaderCase.cpp"
                    ,0x170);
  ppVVar7 = device;
  ppVVar26 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_5a8);
  pVVar2 = *ppVVar26;
  pHVar27 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_4d8);
  (**(code **)(*ppVVar7 + 0x260))(ppVVar7,pVVar2,1,pHVar27->m_internal);
  ppVVar7 = device;
  ppVVar26 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_5a8);
  pVVar2 = *ppVVar26;
  pHVar23 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_310);
  cmdCompleteFence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar23->m_internal;
  pHVar28 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::get
                      ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_3d8);
  (**(code **)(*ppVVar7 + 0x2b0))
            (ppVVar7,pVVar2,1,
             cmdCompleteFence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
             m_allocator,0,1,pHVar28,0,0);
  ppVVar7 = device;
  ppVVar26 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_5a8);
  pVVar2 = *ppVVar26;
  iVar10 = tcu::Vector<int,_3>::x(this_01);
  iVar12 = tcu::Vector<int,_3>::y(this_01);
  iVar13 = tcu::Vector<int,_3>::z(this_01);
  (**(code **)(*ppVVar7 + 0x2e8))(ppVVar7,pVVar2,iVar10,iVar12,iVar13);
  ppVVar7 = device;
  ppVVar26 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_5a8);
  VVar11 = (**(code **)(*ppVVar7 + 0x250))(ppVVar7,*ppVVar26);
  ::vk::checkResult(VVar11,"vkdi.endCommandBuffer(*cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/spirv_assembly/vktSpvAsmComputeShaderCase.cpp"
                    ,0x174);
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&infiniteTimeout,
                    (DeviceInterface *)device,*local_30,0,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_670,(Move *)&infiniteTimeout);
  data_09.deleter.m_deviceIface._0_4_ = (int)local_670.deleter.m_deviceIface;
  data_09.object.m_internal = local_670.object.m_internal;
  data_09.deleter.m_deviceIface._4_4_ = (int)((ulong)local_670.deleter.m_deviceIface >> 0x20);
  data_09.deleter.m_device = local_670.deleter.m_device;
  data_09.deleter.m_allocator = local_670.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)6>_> *)local_650,data_09);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)6>_> *)&infiniteTimeout);
  submitInfo.commandBufferCount = 0;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)0x0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  uStack_6e8 = 4;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x1;
  submitInfo._40_8_ =
       ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                 ((RefBase<vk::VkCommandBuffer_s_*> *)local_5a8);
  ppVVar7 = device;
  pVVar29 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  pHVar30 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_650);
  local_6f0 = pHVar30->m_internal;
  VVar11 = (**(code **)(*ppVVar7 + 0x10))(ppVVar7,pVVar29,1,&uStack_6e8,local_6f0);
  ::vk::checkResult(VVar11,
                    "vkdi.queueSubmit(m_context.getUniversalQueue(), 1, &submitInfo, *cmdCompleteFence)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/spirv_assembly/vktSpvAsmComputeShaderCase.cpp"
                    ,0x187);
  ppVVar7 = device;
  pVVar1 = *local_30;
  pHVar30 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::get
                      ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_650);
  VVar11 = (**(code **)(*ppVVar7 + 0xb0))(ppVVar7,pVVar1,1,pHVar30,0,0xffffffffffffffff);
  ::vk::checkResult(VVar11,
                    "vkdi.waitForFences(device, 1, &cmdCompleteFence.get(), 0u, infiniteTimeout)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/spirv_assembly/vktSpvAsmComputeShaderCase.cpp"
                    ,0x188);
  if (this->m_shaderSpec->verifyIO ==
      (_func_bool_vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>_ptr_vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>_ptr_vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>_ptr_TestLog_ptr
       *)0x0) {
    for (expectedOutput = (BufferSp *)0x0; pBVar5 = expectedOutput,
        pBVar32 = (BufferSp *)
                  std::
                  vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                  ::size(&this->m_shaderSpec->outputs), pBVar5 < pBVar32;
        expectedOutput = (BufferSp *)((long)&expectedOutput->m_ptr + 1)) {
      local_708 = std::
                  vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                  ::operator[](&this->m_shaderSpec->outputs,(size_type)expectedOutput);
      pBVar17 = de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::operator->(local_708);
      iVar10 = (*pBVar17->_vptr_BufferInterface[3])();
      this_03 = std::
                vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
                ::operator[]((vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
                              *)&inputBuffers.
                                 super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (size_type)expectedOutput);
      pAVar19 = de::SharedPtr<vk::Allocation>::operator->(this_03);
      b = ::vk::Allocation::getHostPtr(pAVar19);
      pBVar17 = de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::operator->(local_708);
      iVar12 = (*pBVar17->_vptr_BufferInterface[2])();
      iVar10 = deMemCmp((void *)CONCAT44(extraout_var_02,iVar10),b,CONCAT44(extraout_var_03,iVar12))
      ;
      if (iVar10 != 0) {
        tcu::TestStatus::TestStatus
                  (__return_storage_ptr__,this->m_shaderSpec->failResult,
                   &this->m_shaderSpec->failMessage);
        goto LAB_00a4dd01;
      }
    }
  }
  else {
    pCVar3 = this->m_shaderSpec;
    p_Var4 = pCVar3->verifyIO;
    this_02 = Context::getTestContext((this->super_TestInstance).m_context);
    pTVar31 = tcu::TestContext::getLog(this_02);
    bVar9 = (*p_Var4)(&pCVar3->inputs,
                      (vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
                       *)&inputBuffers.
                          super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,&pCVar3->outputs,
                      pTVar31);
    if (!bVar9) {
      tcu::TestStatus::TestStatus
                (__return_storage_ptr__,this->m_shaderSpec->failResult,
                 &this->m_shaderSpec->failMessage);
      goto LAB_00a4dd01;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_728,"Output match with expected",&local_729);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_728);
  std::__cxx11::string::~string((string *)&local_728);
  std::allocator<char>::~allocator(&local_729);
LAB_00a4dd01:
  outputNdx_1._4_4_ = 1;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)6>_> *)local_650);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_5a8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_548);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_4d8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_478);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_3d8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_378);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_310);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_2b0);
  std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::~vector
            ((vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_> *)
             &numBuffers);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
             *)&descriptorInfos.
                super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
  ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
             *)&outputBuffers.
                super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>::
  ~vector((vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_> *)
          &inputBuffers.
           super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>::
  ~vector((vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_> *)
          &outputAllocs.
           super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus SpvAsmComputeShaderInstance::iterate (void)
{
	const VkPhysicalDeviceFeatures&		features = m_context.getDeviceFeatures();
	const DeviceInterface&				vkdi				= m_context.getDeviceInterface();
	const VkDevice&						device				= m_context.getDevice();
	Allocator&							allocator			= m_context.getDefaultAllocator();

	if ((m_features == COMPUTE_TEST_USES_INT16 || m_features == COMPUTE_TEST_USES_INT16_INT64) && !features.shaderInt16)
	{
		throw tcu::NotSupportedError("shaderInt16 feature is not supported");
	}

	if ((m_features == COMPUTE_TEST_USES_INT64 || m_features == COMPUTE_TEST_USES_INT16_INT64) && !features.shaderInt64)
	{
		throw tcu::NotSupportedError("shaderInt64 feature is not supported");
	}

	vector<AllocationSp>				inputAllocs;
	vector<AllocationSp>				outputAllocs;
	vector<BufferHandleSp>				inputBuffers;
	vector<BufferHandleSp>				outputBuffers;
	vector<VkDescriptorBufferInfo>		descriptorInfos;

	DE_ASSERT(!m_shaderSpec.outputs.empty());
	const size_t						numBuffers			= m_shaderSpec.inputs.size() + m_shaderSpec.outputs.size();

	// Create buffer object, allocate storage, and create view for all input/output buffers.

	for (size_t inputNdx = 0; inputNdx < m_shaderSpec.inputs.size(); ++inputNdx)
	{
		AllocationMp		alloc;
		const BufferSp&		input		= m_shaderSpec.inputs[inputNdx];
		const size_t		numBytes	= input->getNumBytes();
		BufferHandleUp*		buffer		= new BufferHandleUp(createBufferAndBindMemory(vkdi, device, allocator, numBytes, &alloc));

		setMemory(vkdi, device, &*alloc, numBytes, input->data());
		descriptorInfos.push_back(vk::makeDescriptorBufferInfo(**buffer, 0u, numBytes));
		inputBuffers.push_back(BufferHandleSp(buffer));
		inputAllocs.push_back(de::SharedPtr<Allocation>(alloc.release()));
	}

	for (size_t outputNdx = 0; outputNdx < m_shaderSpec.outputs.size(); ++outputNdx)
	{
		AllocationMp		alloc;
		const BufferSp&		output		= m_shaderSpec.outputs[outputNdx];
		const size_t		numBytes	= output->getNumBytes();
		BufferHandleUp*		buffer		= new BufferHandleUp(createBufferAndBindMemory(vkdi, device, allocator, numBytes, &alloc));

		fillMemoryWithValue(vkdi, device, &*alloc, numBytes, 0xff);
		descriptorInfos.push_back(vk::makeDescriptorBufferInfo(**buffer, 0u, numBytes));
		outputBuffers.push_back(BufferHandleSp(buffer));
		outputAllocs.push_back(de::SharedPtr<Allocation>(alloc.release()));
	}

	// Create layouts and descriptor set.

	Unique<VkDescriptorSetLayout>		descriptorSetLayout	(createDescriptorSetLayout(vkdi, device, numBuffers));
	Unique<VkPipelineLayout>			pipelineLayout		(createPipelineLayout(vkdi, device, *descriptorSetLayout));
	Unique<VkDescriptorPool>			descriptorPool		(createDescriptorPool(vkdi, device, (deUint32)numBuffers));
	Unique<VkDescriptorSet>				descriptorSet		(createDescriptorSet(vkdi, device, *descriptorPool, *descriptorSetLayout, numBuffers, descriptorInfos));

	// Create compute shader and pipeline.

	const ProgramBinary&				binary				= m_context.getBinaryCollection().get("compute");
	Unique<VkShaderModule>				module				(createShaderModule(vkdi, device, binary, (VkShaderModuleCreateFlags)0u));

	Unique<VkPipeline>					computePipeline		(createComputePipeline(vkdi, device, *pipelineLayout, *module, m_shaderSpec.entryPoint.c_str(), m_shaderSpec.specConstants));

	// Create command buffer and record commands

	const Unique<VkCommandPool>			cmdPool				(createCommandPool(vkdi, device, m_context.getUniversalQueueFamilyIndex()));
	Unique<VkCommandBuffer>				cmdBuffer			(allocateCommandBuffer(vkdi, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	const VkCommandBufferBeginInfo		cmdBufferBeginInfo	=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,	// sType
		DE_NULL,										// pNext
		VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT,
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	const tcu::IVec3&				numWorkGroups		= m_shaderSpec.numWorkGroups;

	VK_CHECK(vkdi.beginCommandBuffer(*cmdBuffer, &cmdBufferBeginInfo));
	vkdi.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *computePipeline);
	vkdi.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0, 1, &descriptorSet.get(), 0, DE_NULL);
	vkdi.cmdDispatch(*cmdBuffer, numWorkGroups.x(), numWorkGroups.y(), numWorkGroups.z());
	VK_CHECK(vkdi.endCommandBuffer(*cmdBuffer));

	// Create fence and run.

	const Unique<VkFence>			cmdCompleteFence	(createFence(vkdi, device));
	const deUint64					infiniteTimeout		= ~(deUint64)0u;
	const VkSubmitInfo				submitInfo			=
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,
		DE_NULL,
		0u,
		(const VkSemaphore*)DE_NULL,
		(const VkPipelineStageFlags*)DE_NULL,
		1u,
		&cmdBuffer.get(),
		0u,
		(const VkSemaphore*)DE_NULL,
	};

	VK_CHECK(vkdi.queueSubmit(m_context.getUniversalQueue(), 1, &submitInfo, *cmdCompleteFence));
	VK_CHECK(vkdi.waitForFences(device, 1, &cmdCompleteFence.get(), 0u, infiniteTimeout)); // \note: timeout is failure

	// Check output.
	if (m_shaderSpec.verifyIO)
	{
		if (!(*m_shaderSpec.verifyIO)(m_shaderSpec.inputs, outputAllocs, m_shaderSpec.outputs, m_context.getTestContext().getLog()))
			return tcu::TestStatus(m_shaderSpec.failResult, m_shaderSpec.failMessage);
	}
	else
	{
		for (size_t outputNdx = 0; outputNdx < m_shaderSpec.outputs.size(); ++outputNdx)
		{
			const BufferSp& expectedOutput = m_shaderSpec.outputs[outputNdx];
			if (deMemCmp(expectedOutput->data(), outputAllocs[outputNdx]->getHostPtr(), expectedOutput->getNumBytes()))
				return tcu::TestStatus(m_shaderSpec.failResult, m_shaderSpec.failMessage);
		}
	}

	return tcu::TestStatus::pass("Output match with expected");
}